

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O1

MockSupport * mock(SimpleString *mockName,MockFailureReporter *failureReporterForThisCall)

{
  bool bVar1;
  MockSupport *pMVar2;
  SimpleString SStack_28;
  
  SimpleString::SimpleString(&SStack_28,"");
  bVar1 = operator!=(mockName,&SStack_28);
  if (bVar1) {
    pMVar2 = MockSupport::getMockSupportScope(&global_mock,mockName);
  }
  else {
    pMVar2 = &global_mock;
  }
  SimpleString::~SimpleString(&SStack_28);
  (*pMVar2->_vptr_MockSupport[0x2a])(pMVar2,failureReporterForThisCall);
  (*pMVar2->_vptr_MockSupport[0x2b])(pMVar2);
  return pMVar2;
}

Assistant:

MockSupport& mock(const SimpleString& mockName, MockFailureReporter* failureReporterForThisCall)
{
    MockSupport& mock_support = (mockName != "") ? *global_mock.getMockSupportScope(mockName) : global_mock;
    mock_support.setActiveReporter(failureReporterForThisCall);
    mock_support.setDefaultComparatorsAndCopiersRepository();
    return mock_support;
}